

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void close_func(LexState *ls)

{
  lua_State *L_00;
  FuncState *fs_00;
  Proto *pPVar1;
  int first;
  Instruction *pIVar2;
  ls_byte *plVar3;
  AbsLineInfo *pAVar4;
  TValue *pTVar5;
  Proto **ppPVar6;
  LocVar *pLVar7;
  Upvaldesc *pUVar8;
  Proto *f;
  FuncState *fs;
  lua_State *L;
  LexState *ls_local;
  
  L_00 = ls->L;
  fs_00 = ls->fs;
  pPVar1 = fs_00->f;
  first = luaY_nvarstack(fs_00);
  luaK_ret(fs_00,first,0);
  leaveblock(fs_00);
  luaK_finish(fs_00);
  pIVar2 = (Instruction *)luaM_shrinkvector_(L_00,pPVar1->code,&pPVar1->sizecode,fs_00->pc,4);
  pPVar1->code = pIVar2;
  plVar3 = (ls_byte *)luaM_shrinkvector_(L_00,pPVar1->lineinfo,&pPVar1->sizelineinfo,fs_00->pc,1);
  pPVar1->lineinfo = plVar3;
  pAVar4 = (AbsLineInfo *)
           luaM_shrinkvector_(L_00,pPVar1->abslineinfo,&pPVar1->sizeabslineinfo,fs_00->nabslineinfo,
                              8);
  pPVar1->abslineinfo = pAVar4;
  pTVar5 = (TValue *)luaM_shrinkvector_(L_00,pPVar1->k,&pPVar1->sizek,fs_00->nk,0x10);
  pPVar1->k = pTVar5;
  ppPVar6 = (Proto **)luaM_shrinkvector_(L_00,pPVar1->p,&pPVar1->sizep,fs_00->np,8);
  pPVar1->p = ppPVar6;
  pLVar7 = (LocVar *)
           luaM_shrinkvector_(L_00,pPVar1->locvars,&pPVar1->sizelocvars,(int)fs_00->ndebugvars,0x10)
  ;
  pPVar1->locvars = pLVar7;
  pUVar8 = (Upvaldesc *)
           luaM_shrinkvector_(L_00,pPVar1->upvalues,&pPVar1->sizeupvalues,(uint)fs_00->nups,0x10);
  pPVar1->upvalues = pUVar8;
  ls->fs = fs_00->prev;
  if (0 < L_00->l_G->GCdebt) {
    luaC_step(L_00);
  }
  return;
}

Assistant:

static void close_func (LexState *ls) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  luaK_ret(fs, luaY_nvarstack(fs), 0);  /* final return */
  leaveblock(fs);
  lua_assert(fs->bl == NULL);
  luaK_finish(fs);
  luaM_shrinkvector(L, f->code, f->sizecode, fs->pc, Instruction);
  luaM_shrinkvector(L, f->lineinfo, f->sizelineinfo, fs->pc, ls_byte);
  luaM_shrinkvector(L, f->abslineinfo, f->sizeabslineinfo,
                       fs->nabslineinfo, AbsLineInfo);
  luaM_shrinkvector(L, f->k, f->sizek, fs->nk, TValue);
  luaM_shrinkvector(L, f->p, f->sizep, fs->np, Proto *);
  luaM_shrinkvector(L, f->locvars, f->sizelocvars, fs->ndebugvars, LocVar);
  luaM_shrinkvector(L, f->upvalues, f->sizeupvalues, fs->nups, Upvaldesc);
  ls->fs = fs->prev;
  luaC_checkGC(L);
}